

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O0

void duckdb::BinaryExecutor::
     ExecuteFlat<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::hugeint_t,duckdb::BinaryStandardOperatorWrapper,duckdb::LeastCommonMultipleOperator,bool,false,true>
               (Vector *left,Vector *right,Vector *result,idx_t count,bool fun)

{
  byte bVar1;
  bool bVar2;
  hugeint_t *count_00;
  TemplatedValidityMask<unsigned_long> *in_RCX;
  Vector *in_RDX;
  byte in_R8B;
  ValidityMask *result_validity;
  hugeint_t *result_data;
  hugeint_t *rdata;
  hugeint_t *ldata;
  bool in_stack_000000df;
  ValidityMask *in_stack_000000e0;
  idx_t in_stack_000000e8;
  hugeint_t *in_stack_000000f0;
  hugeint_t *in_stack_000000f8;
  hugeint_t *in_stack_00000100;
  Vector *in_stack_ffffffffffffffb0;
  undefined7 in_stack_ffffffffffffffd8;
  
  bVar1 = in_R8B & 1;
  count_00 = FlatVector::GetData<duckdb::hugeint_t>((Vector *)0xe2bc2b);
  FlatVector::GetData<duckdb::hugeint_t>((Vector *)0xe2bc3a);
  bVar2 = ConstantVector::IsNull((Vector *)0xe2bc49);
  if (bVar2) {
    duckdb::Vector::SetVectorType((VectorType)in_RDX);
    duckdb::ConstantVector::SetNull(in_RDX,true);
  }
  else {
    duckdb::Vector::SetVectorType((VectorType)in_RDX);
    FlatVector::GetData<duckdb::hugeint_t>((Vector *)0xe2bc88);
    FlatVector::Validity((Vector *)0xe2bc97);
    bVar2 = BinaryStandardOperatorWrapper::AddsNulls();
    if (bVar2) {
      FlatVector::Validity((Vector *)0xe2bcbb);
      TemplatedValidityMask<unsigned_long>::Copy
                (in_RCX,(TemplatedValidityMask<unsigned_long> *)
                        CONCAT17(bVar1,in_stack_ffffffffffffffd8),(idx_t)count_00);
    }
    else {
      FlatVector::Validity((Vector *)0xe2bce2);
      FlatVector::SetValidity(in_stack_ffffffffffffffb0,(ValidityMask *)in_RDX);
    }
    ExecuteFlatLoop<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::hugeint_t,duckdb::BinaryStandardOperatorWrapper,duckdb::LeastCommonMultipleOperator,bool,false,true>
              (in_stack_00000100,in_stack_000000f8,in_stack_000000f0,in_stack_000000e8,
               in_stack_000000e0,in_stack_000000df);
  }
  return;
}

Assistant:

static void ExecuteFlat(Vector &left, Vector &right, Vector &result, idx_t count, FUNC fun) {
		auto ldata = FlatVector::GetData<LEFT_TYPE>(left);
		auto rdata = FlatVector::GetData<RIGHT_TYPE>(right);

		if ((LEFT_CONSTANT && ConstantVector::IsNull(left)) || (RIGHT_CONSTANT && ConstantVector::IsNull(right))) {
			// either left or right is constant NULL: result is constant NULL
			result.SetVectorType(VectorType::CONSTANT_VECTOR);
			ConstantVector::SetNull(result, true);
			return;
		}

		result.SetVectorType(VectorType::FLAT_VECTOR);
		auto result_data = FlatVector::GetData<RESULT_TYPE>(result);
		auto &result_validity = FlatVector::Validity(result);
		if (LEFT_CONSTANT) {
			if (OPWRAPPER::AddsNulls()) {
				result_validity.Copy(FlatVector::Validity(right), count);
			} else {
				FlatVector::SetValidity(result, FlatVector::Validity(right));
			}
		} else if (RIGHT_CONSTANT) {
			if (OPWRAPPER::AddsNulls()) {
				result_validity.Copy(FlatVector::Validity(left), count);
			} else {
				FlatVector::SetValidity(result, FlatVector::Validity(left));
			}
		} else {
			if (OPWRAPPER::AddsNulls()) {
				result_validity.Copy(FlatVector::Validity(left), count);
				if (result_validity.AllValid()) {
					result_validity.Copy(FlatVector::Validity(right), count);
				} else {
					result_validity.Combine(FlatVector::Validity(right), count);
				}
			} else {
				FlatVector::SetValidity(result, FlatVector::Validity(left));
				result_validity.Combine(FlatVector::Validity(right), count);
			}
		}
		ExecuteFlatLoop<LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE, OPWRAPPER, OP, FUNC, LEFT_CONSTANT, RIGHT_CONSTANT>(
		    ldata, rdata, result_data, count, result_validity, fun);
	}